

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_4_sse2(uint8_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  unkbyte10 Var20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  ulong *puVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong in_RSI;
  void *in_RDI;
  void *a;
  undefined8 *in_R8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong uVar42;
  __m128i alVar43;
  __m128i b;
  __m128i a_00;
  __m128i a_01;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i ps1ps0;
  __m128i qs1qs0;
  __m128i thresh;
  __m128i limit;
  __m128i zero;
  __m128i abs_p1q1p0q0;
  __m128i zero_1;
  __m128i hev;
  __m128i flat;
  __m128i mask;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i q0p0;
  __m128i q1p1;
  __m128i ff;
  __m128i t80;
  __m128i t3t4;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work;
  __m128i filter2filter1;
  __m128i filter;
  undefined1 local_8c8 [16];
  undefined8 local_8b8 [2];
  undefined8 local_8a8 [2];
  undefined8 local_898 [2];
  ulong local_888 [2];
  ulong local_878 [2];
  undefined1 local_868;
  undefined1 uStack_867;
  undefined1 uStack_866;
  undefined1 uStack_865;
  undefined1 uStack_864;
  undefined1 uStack_863;
  undefined1 uStack_862;
  undefined1 uStack_861;
  undefined1 uStack_860;
  undefined1 uStack_85f;
  undefined1 uStack_85e;
  undefined1 uStack_85d;
  undefined1 uStack_85c;
  undefined1 uStack_85b;
  undefined1 uStack_85a;
  undefined1 uStack_859;
  undefined1 local_858 [16];
  undefined8 local_848;
  undefined8 uStack_840;
  int local_814;
  void *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  byte local_728;
  byte bStack_727;
  byte bStack_726;
  byte bStack_725;
  byte bStack_724;
  byte bStack_723;
  byte bStack_722;
  byte bStack_721;
  byte bStack_720;
  byte bStack_71f;
  byte bStack_71e;
  byte bStack_71d;
  byte bStack_71c;
  byte bStack_71b;
  byte bStack_71a;
  byte bStack_719;
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  ulong local_6e8;
  ulong uStack_6e0;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 local_6c8;
  undefined4 uStack_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  ulong *local_6a8;
  ulong *local_6a0;
  undefined8 *local_698;
  undefined1 (*local_690) [16];
  undefined1 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined4 local_5f8;
  undefined4 uStack_5f4;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 local_5c8;
  undefined4 uStack_5c4;
  undefined8 local_5b8;
  ulong uStack_5b0;
  undefined8 local_5a8;
  ulong uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined4 local_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined1 local_438;
  undefined1 uStack_437;
  undefined1 uStack_436;
  undefined1 uStack_435;
  undefined1 uStack_434;
  undefined1 uStack_433;
  undefined1 uStack_432;
  undefined1 uStack_431;
  undefined1 uStack_430;
  undefined1 uStack_42f;
  undefined1 uStack_42e;
  undefined1 uStack_42d;
  undefined1 uStack_42c;
  undefined1 uStack_42b;
  undefined1 uStack_42a;
  undefined1 uStack_429;
  ulong local_428;
  ulong uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  ulong local_408;
  undefined8 uStack_400;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong *local_3a8;
  ulong *local_3a0;
  undefined1 *local_398;
  undefined8 *local_390;
  ulong *local_388;
  undefined4 *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  ulong local_358;
  ulong uStack_350;
  undefined8 local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  undefined8 local_328;
  ulong uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2c9;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong local_288;
  ulong uStack_280;
  undefined1 local_278 [16];
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  undefined8 local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  undefined8 uStack_120;
  ulong local_118;
  ulong uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  ulong uStack_80;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_814 = (int)in_RSI;
  local_808 = 0;
  uStack_800 = 0;
  local_848 = 0;
  uStack_840 = 0;
  local_798 = *in_RDX;
  uStack_790 = 0;
  local_7b8 = *in_RCX;
  uStack_7b0 = 0;
  uStack_7e0 = 0;
  uStack_7f0 = 0;
  local_7e8._0_4_ = (undefined4)local_798;
  local_7e8._4_4_ = (undefined4)((ulong)local_798 >> 0x20);
  local_7f8._0_4_ = (undefined4)local_7b8;
  local_7f8._4_4_ = (undefined4)((ulong)local_7b8 >> 0x20);
  local_858._0_4_ = (undefined4)local_7e8;
  local_858._4_4_ = (undefined4)local_7f8;
  local_858._8_4_ = local_7e8._4_4_;
  local_858._12_4_ = local_7f8._4_4_;
  local_7d8 = *in_R8;
  uStack_7d0 = 0;
  uStack_760 = 0;
  local_778 = 0;
  uStack_770 = 0;
  local_768._0_1_ = (undefined1)local_7d8;
  local_768._1_1_ = (undefined1)((ulong)local_7d8 >> 8);
  local_768._2_1_ = (undefined1)((ulong)local_7d8 >> 0x10);
  local_768._3_1_ = (undefined1)((ulong)local_7d8 >> 0x18);
  local_768._4_1_ = (undefined1)((ulong)local_7d8 >> 0x20);
  local_768._5_1_ = (undefined1)((ulong)local_7d8 >> 0x28);
  local_768._6_1_ = (undefined1)((ulong)local_7d8 >> 0x30);
  local_768._7_1_ = (undefined1)((ulong)local_7d8 >> 0x38);
  local_868 = (undefined1)local_768;
  uStack_867 = 0;
  uStack_866 = local_768._1_1_;
  uStack_865 = 0;
  uStack_864 = local_768._2_1_;
  uStack_863 = 0;
  uStack_862 = local_768._3_1_;
  uStack_861 = 0;
  uStack_860 = local_768._4_1_;
  uStack_85f = 0;
  uStack_85e = local_768._5_1_;
  uStack_85d = 0;
  uStack_85c = local_768._6_1_;
  uStack_85b = 0;
  uStack_85a = local_768._7_1_;
  uStack_859 = 0;
  local_810 = in_RDI;
  local_7f8 = local_7b8;
  local_7e8 = local_798;
  local_768 = local_7d8;
  xx_loadl_32((void *)((long)in_RDI - (long)(local_814 * 2)));
  local_898[0] = extraout_XMM0_Qa;
  xx_loadl_32((void *)((long)local_810 - (long)local_814));
  local_8a8[0] = extraout_XMM0_Qa_00;
  xx_loadl_32(local_810);
  a = (void *)((long)local_810 + (long)local_814);
  local_8b8[0] = extraout_XMM0_Qa_01;
  alVar43 = xx_loadl_32(a);
  alVar43[0] = alVar43[1];
  local_670 = local_898;
  local_678 = local_8a8;
  local_680 = local_8b8;
  local_688 = local_8c8;
  local_690 = &local_858;
  local_698 = (undefined8 *)&local_868;
  local_6a0 = local_878;
  local_6a8 = local_888;
  local_668 = 0;
  uStack_660 = 0;
  local_748 = 0;
  uStack_740 = 0;
  local_5c8 = (undefined4)local_898[0];
  uStack_5c4 = (undefined4)((ulong)local_898[0] >> 0x20);
  local_5d8 = (undefined4)extraout_XMM0_Qa_02;
  uStack_5d4 = (undefined4)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  local_6b8 = local_5c8;
  uStack_6b4 = local_5d8;
  uStack_6b0 = uStack_5c4;
  uStack_6ac = uStack_5d4;
  local_5e8 = (undefined4)local_8a8[0];
  uStack_5e4 = (undefined4)((ulong)local_8a8[0] >> 0x20);
  local_5f8 = (undefined4)local_8b8[0];
  uStack_5f4 = (undefined4)((ulong)local_8b8[0] >> 0x20);
  local_6c8 = local_5e8;
  uStack_6c4 = local_5f8;
  uStack_6c0 = uStack_5e4;
  uStack_6bc = uStack_5f4;
  local_608 = CONCAT44(local_5f8,local_5e8);
  uStack_600 = CONCAT44(uStack_5f4,uStack_5e4);
  local_618 = CONCAT44(local_5d8,local_5c8);
  uStack_610 = CONCAT44(uStack_5d4,uStack_5c4);
  local_6d8 = local_5e8;
  uStack_6d4 = local_5c8;
  uStack_6d0 = local_5f8;
  uStack_6cc = local_5d8;
  local_6e8 = CONCAT44(local_5d8,local_5f8);
  uStack_6e0 = 0;
  alVar43[1] = (longlong)in_RCX;
  a_00[1] = in_RSI;
  a_00[0] = (longlong)a;
  alVar43 = abs_diff(a_00,alVar43);
  b[0] = alVar43[1];
  local_728 = (byte)extraout_XMM0_Qa_03;
  bStack_727 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_726 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_725 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_724 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_723 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_722 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_721 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_720 = (byte)extraout_XMM0_Qb;
  bStack_71f = (byte)((ulong)extraout_XMM0_Qb >> 8);
  bStack_71e = (byte)((ulong)extraout_XMM0_Qb >> 0x10);
  bStack_71d = (byte)((ulong)extraout_XMM0_Qb >> 0x18);
  bStack_71c = (byte)((ulong)extraout_XMM0_Qb >> 0x20);
  bStack_71b = (byte)((ulong)extraout_XMM0_Qb >> 0x28);
  bStack_71a = (byte)((ulong)extraout_XMM0_Qb >> 0x30);
  bStack_719 = (byte)((ulong)extraout_XMM0_Qb >> 0x38);
  b[1] = (longlong)in_RCX;
  a_01[1] = in_RSI;
  a_01[0] = (longlong)a;
  abs_diff(a_01,b);
  puVar23 = local_6a0;
  local_548[1] = bStack_727;
  local_548[0] = local_728;
  local_548[2] = bStack_726;
  local_548[3] = bStack_725;
  local_548[4] = bStack_724;
  local_548[5] = bStack_723;
  local_548[6] = bStack_722;
  local_548[7] = bStack_721;
  local_548[8] = bStack_720;
  local_548[9] = bStack_71f;
  local_548[10] = bStack_71e;
  local_548[0xb] = bStack_71d;
  local_548[0xc] = bStack_71c;
  local_548[0xd] = bStack_71b;
  local_548[0xe] = bStack_71a;
  local_548[0xf] = bStack_719;
  local_558 = local_548 >> 0x20;
  local_728 = (local_728 < bStack_724) * bStack_724 | (local_728 >= bStack_724) * local_728;
  bStack_727 = (bStack_727 < bStack_723) * bStack_723 | (bStack_727 >= bStack_723) * bStack_727;
  bStack_726 = (bStack_726 < bStack_722) * bStack_722 | (bStack_726 >= bStack_722) * bStack_726;
  bStack_725 = (bStack_725 < bStack_721) * bStack_721 | (bStack_725 >= bStack_721) * bStack_725;
  bStack_724 = (bStack_724 < bStack_720) * bStack_720 | (bStack_724 >= bStack_720) * bStack_724;
  bStack_723 = (bStack_723 < bStack_71f) * bStack_71f | (bStack_723 >= bStack_71f) * bStack_723;
  bStack_722 = (bStack_722 < bStack_71e) * bStack_71e | (bStack_722 >= bStack_71e) * bStack_722;
  bStack_721 = (bStack_721 < bStack_71d) * bStack_71d | (bStack_721 >= bStack_71d) * bStack_721;
  bStack_720 = (bStack_720 < bStack_71c) * bStack_71c | (bStack_720 >= bStack_71c) * bStack_720;
  bStack_71f = (bStack_71f < bStack_71b) * bStack_71b | (bStack_71f >= bStack_71b) * bStack_71f;
  bStack_71e = (bStack_71e < bStack_71a) * bStack_71a | (bStack_71e >= bStack_71a) * bStack_71e;
  bStack_71d = (bStack_71d < bStack_719) * bStack_719 | (bStack_71d >= bStack_719) * bStack_71d;
  local_588 = CONCAT17(bStack_721,
                       CONCAT16(bStack_722,
                                CONCAT15(bStack_723,
                                         CONCAT14(bStack_724,
                                                  CONCAT13(bStack_725,
                                                           CONCAT12(bStack_726,
                                                                    CONCAT11(bStack_727,local_728)))
                                                 ))));
  uStack_580 = CONCAT17(bStack_719,
                        CONCAT16(bStack_71a,
                                 CONCAT15(bStack_71b,
                                          CONCAT14(bStack_71c,
                                                   CONCAT13(bStack_71d,
                                                            CONCAT12(bStack_71e,
                                                                     CONCAT11(bStack_71f,bStack_720)
                                                                    ))))));
  local_598 = local_748;
  uVar27 = local_598;
  uStack_590 = uStack_740;
  local_598._0_1_ = (char)local_748;
  local_598._1_1_ = (char)((ulong)local_748 >> 8);
  local_598._2_1_ = (char)((ulong)local_748 >> 0x10);
  local_598._3_1_ = (char)((ulong)local_748 >> 0x18);
  local_598._4_1_ = (char)((ulong)local_748 >> 0x20);
  local_598._5_1_ = (char)((ulong)local_748 >> 0x28);
  local_598._6_1_ = (char)((ulong)local_748 >> 0x30);
  local_598._7_1_ = (char)((ulong)local_748 >> 0x38);
  local_738._0_2_ = CONCAT11((char)local_598,local_728);
  local_738._0_3_ = CONCAT12(bStack_727,(short)local_738);
  local_738._0_4_ = CONCAT13(local_598._1_1_,(undefined3)local_738);
  local_738._0_5_ = CONCAT14(bStack_726,(undefined4)local_738);
  local_738._0_6_ = CONCAT15(local_598._2_1_,(undefined5)local_738);
  local_738._0_7_ = CONCAT16(bStack_725,(undefined6)local_738);
  local_738 = CONCAT17(local_598._3_1_,(undefined7)local_738);
  _local_738 = CONCAT18(bStack_724,local_738);
  _local_738 = CONCAT19(local_598._4_1_,_local_738);
  Var20 = _local_738;
  uStack_730._2_1_ = bStack_723;
  uStack_730._3_1_ = local_598._5_1_;
  auVar21 = _local_738;
  uStack_730._4_1_ = bStack_722;
  uStack_730._5_1_ = local_598._6_1_;
  auVar22 = _local_738;
  uStack_730._6_1_ = bStack_721;
  uStack_730._7_1_ = local_598._7_1_;
  uVar1 = *local_698;
  uVar2 = local_698[1];
  local_488 = local_738;
  uVar33 = local_488;
  uStack_480 = uStack_730;
  uVar34 = uStack_480;
  local_488._2_2_ = (short)((uint)(undefined4)local_738 >> 0x10);
  local_488._4_2_ = (short)((uint6)(undefined6)local_738 >> 0x20);
  local_488._6_2_ = (short)(local_738 >> 0x30);
  uStack_480._0_2_ = (short)((unkuint10)Var20 >> 0x40);
  uStack_480._2_2_ = auVar21._10_2_;
  uStack_480._4_2_ = auVar22._12_2_;
  uStack_480._6_2_ = local_738._14_2_;
  local_498._0_2_ = (short)uVar1;
  local_498._2_2_ = (short)((ulong)uVar1 >> 0x10);
  local_498._4_2_ = (short)((ulong)uVar1 >> 0x20);
  local_498._6_2_ = (short)((ulong)uVar1 >> 0x30);
  uStack_490._0_2_ = (short)uVar2;
  uStack_490._2_2_ = (short)((ulong)uVar2 >> 0x10);
  uStack_490._4_2_ = (short)((ulong)uVar2 >> 0x20);
  uStack_490._6_2_ = (short)((ulong)uVar2 >> 0x30);
  local_738._0_4_ =
       CONCAT22(-(ushort)(local_498._2_2_ < local_488._2_2_),
                -(ushort)((short)local_498 < (short)local_738));
  local_738._0_6_ = CONCAT24(-(ushort)(local_498._4_2_ < local_488._4_2_),(undefined4)local_738);
  local_738 = CONCAT26(-(ushort)(local_498._6_2_ < local_488._6_2_),(undefined6)local_738);
  uStack_730._0_2_ = -(ushort)((short)uStack_490 < (short)uStack_480);
  uStack_730._2_2_ = -(ushort)(uStack_490._2_2_ < uStack_480._2_2_);
  uStack_730._4_2_ = -(ushort)(uStack_490._4_2_ < uStack_480._4_2_);
  uStack_730._6_2_ = -(ushort)(uStack_490._6_2_ < uStack_480._6_2_);
  local_448 = local_738;
  uStack_440 = uStack_730;
  local_458 = local_738;
  uStack_450 = uStack_730;
  auVar8._8_8_ = uStack_730;
  auVar8._0_8_ = local_738;
  auVar7._8_8_ = uStack_730;
  auVar7._0_8_ = local_738;
  auVar38 = packsswb(auVar8,auVar7);
  local_738 = auVar38._0_8_;
  uStack_730 = auVar38._8_8_;
  local_628 = local_738;
  uVar25 = local_628;
  uStack_620 = uStack_730;
  local_638 = local_738;
  uStack_630 = uStack_730;
  local_628._0_4_ = auVar38._0_4_;
  local_628._4_4_ = auVar38._4_4_;
  local_738 = CONCAT44((undefined4)local_628,(undefined4)local_628);
  uStack_730._0_4_ = local_628._4_4_;
  uStack_730._4_4_ = local_628._4_4_;
  auVar40._8_8_ = extraout_XMM0_Qb_00;
  auVar40._0_8_ = extraout_XMM0_Qa_04;
  auVar39._8_8_ = extraout_XMM0_Qb_00;
  auVar39._0_8_ = extraout_XMM0_Qa_04;
  local_6f8 = paddusb(auVar40,auVar39);
  auVar38._8_8_ = extraout_XMM0_Qb_00;
  auVar38._0_8_ = extraout_XMM0_Qa_04;
  local_708._0_8_ = auVar38._4_8_;
  uStack_5b0 = extraout_XMM0_Qb_00 >> 0x20;
  local_5a8 = local_708._0_8_;
  uVar26 = local_5a8;
  local_5b8 = local_708._0_8_;
  local_5a8._0_1_ = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  local_5a8._1_1_ = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  local_5a8._2_1_ = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  local_5a8._3_1_ = (undefined1)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  local_5a8._4_1_ = (undefined1)extraout_XMM0_Qb_00;
  local_5a8._5_1_ = (undefined1)(extraout_XMM0_Qb_00 >> 8);
  local_5a8._6_1_ = (undefined1)(extraout_XMM0_Qb_00 >> 0x10);
  local_5a8._7_1_ = (undefined1)(extraout_XMM0_Qb_00 >> 0x18);
  local_708[1] = (byte)local_5a8;
  local_708[0] = (byte)local_5a8;
  local_708[2] = local_5a8._1_1_;
  local_708[3] = local_5a8._1_1_;
  local_708[4] = local_5a8._2_1_;
  local_708[5] = local_5a8._2_1_;
  local_708[6] = local_5a8._3_1_;
  local_708[7] = local_5a8._3_1_;
  local_708[8] = local_5a8._4_1_;
  local_708[9] = local_5a8._4_1_;
  Var20 = local_708._0_10_;
  local_708[10] = local_5a8._5_1_;
  local_708[0xb] = local_5a8._5_1_;
  auVar21 = local_708._0_12_;
  local_708[0xc] = local_5a8._6_1_;
  local_708[0xd] = local_5a8._6_1_;
  auVar22 = local_708._0_14_;
  local_708[0xe] = local_5a8._7_1_;
  local_708[0xf] = local_5a8._7_1_;
  local_4e8 = local_708._0_8_;
  uVar31 = local_4e8;
  uStack_4e0 = local_708._8_8_;
  uVar32 = uStack_4e0;
  local_4ec = 9;
  local_4e8._2_2_ = SUB42(local_708._0_4_,2);
  local_4e8._4_2_ = SUB62(local_708._0_6_,4);
  local_4e8._6_2_ = SUB82(local_708._0_8_,6);
  uStack_4e0._0_2_ = SUB102(Var20,8);
  uStack_4e0._2_2_ = auVar21._10_2_;
  uStack_4e0._4_2_ = auVar22._12_2_;
  uStack_4e0._6_2_ = local_708._14_2_;
  local_708[1] = 0;
  local_708[0] = (byte)local_5a8 >> 1;
  local_708._2_2_ = local_4e8._2_2_ >> 9;
  local_708._4_2_ = local_4e8._4_2_ >> 9;
  local_708._6_2_ = local_4e8._6_2_ >> 9;
  local_708._8_2_ = (ushort)uStack_4e0 >> 9;
  local_708._10_2_ = uStack_4e0._2_2_ >> 9;
  local_708._12_2_ = uStack_4e0._4_2_ >> 9;
  local_708._14_2_ = uStack_4e0._6_2_ >> 9;
  local_468 = local_708._0_8_;
  uStack_460 = local_708._8_8_;
  local_478 = local_708._0_8_;
  uStack_470 = local_708._8_8_;
  auVar6._8_8_ = local_708._8_8_;
  auVar6._0_8_ = local_708._0_8_;
  auVar5._8_8_ = local_708._8_8_;
  auVar5._0_8_ = local_708._0_8_;
  local_708 = packsswb(auVar6,auVar5);
  local_528 = local_6f8._0_8_;
  uStack_520 = local_6f8._8_8_;
  local_538 = local_708._0_8_;
  uStack_530 = local_708._8_8_;
  auVar38 = paddusb(local_6f8,local_708);
  local_718._0_8_ = auVar38._0_8_;
  local_718._8_8_ = auVar38._8_8_;
  uVar4 = CONCAT13(bStack_725,CONCAT12(bStack_726,CONCAT11(bStack_727,local_728)));
  uVar3 = CONCAT17(bStack_721,CONCAT16(bStack_722,CONCAT15(bStack_723,CONCAT14(bStack_724,uVar4))));
  uStack_650 = CONCAT17(bStack_719,
                        CONCAT16(bStack_71a,
                                 CONCAT15(bStack_71b,
                                          CONCAT14(bStack_71c,
                                                   CONCAT13(bStack_71d,
                                                            CONCAT12(bStack_71e,
                                                                     CONCAT11(bStack_71f,bStack_720)
                                                                    ))))));
  local_648 = local_718._0_8_;
  uVar24 = local_648;
  uStack_640 = local_718._8_8_;
  local_648._0_4_ = auVar38._0_4_;
  local_648._4_4_ = auVar38._4_4_;
  local_658._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_718._4_4_ = uVar4;
  local_718._0_4_ = (undefined4)local_648;
  local_718._8_4_ = local_648._4_4_;
  local_718._12_4_ = local_658._4_4_;
  local_4b8 = *(undefined8 *)*local_690;
  uStack_4b0 = *(undefined8 *)(*local_690 + 8);
  local_4a8 = local_718._0_8_;
  uStack_4a0 = local_718._8_8_;
  auVar41._8_8_ = local_718._8_8_;
  auVar41._0_8_ = local_718._0_8_;
  auVar38 = psubusb(auVar41,*local_690);
  local_718._0_8_ = auVar38._0_8_;
  local_718._8_8_ = auVar38._8_8_;
  local_568 = local_718._0_8_;
  uVar29 = local_568;
  uStack_560 = local_718._8_8_;
  uVar30 = uStack_560;
  local_578 = local_748;
  uStack_570 = uStack_740;
  uVar28 = uStack_570;
  local_568._0_1_ = auVar38[0];
  local_568._1_1_ = auVar38[1];
  local_568._2_1_ = auVar38[2];
  local_568._3_1_ = auVar38[3];
  local_568._4_1_ = auVar38[4];
  local_568._5_1_ = auVar38[5];
  local_568._6_1_ = auVar38[6];
  local_568._7_1_ = auVar38[7];
  uStack_560._0_1_ = auVar38[8];
  uStack_560._1_1_ = auVar38[9];
  uStack_560._2_1_ = auVar38[10];
  uStack_560._3_1_ = auVar38[0xb];
  uStack_560._4_1_ = auVar38[0xc];
  uStack_560._5_1_ = auVar38[0xd];
  uStack_560._6_1_ = auVar38[0xe];
  uStack_560._7_1_ = auVar38[0xf];
  uStack_570._0_1_ = (char)uStack_740;
  uStack_570._1_1_ = (char)((ulong)uStack_740 >> 8);
  uStack_570._2_1_ = (char)((ulong)uStack_740 >> 0x10);
  uStack_570._3_1_ = (char)((ulong)uStack_740 >> 0x18);
  uStack_570._4_1_ = (char)((ulong)uStack_740 >> 0x20);
  uStack_570._5_1_ = (char)((ulong)uStack_740 >> 0x28);
  uStack_570._6_1_ = (char)((ulong)uStack_740 >> 0x30);
  uStack_570._7_1_ = (char)((ulong)uStack_740 >> 0x38);
  local_718[1] = -(local_568._1_1_ == local_598._1_1_);
  local_718[0] = -((char)local_568 == (char)local_598);
  local_718[2] = -(local_568._2_1_ == local_598._2_1_);
  local_718[3] = -(local_568._3_1_ == local_598._3_1_);
  local_718[4] = -(local_568._4_1_ == local_598._4_1_);
  local_718[5] = -(local_568._5_1_ == local_598._5_1_);
  local_718[6] = -(local_568._6_1_ == local_598._6_1_);
  local_718[7] = -(local_568._7_1_ == local_598._7_1_);
  local_718[8] = -((char)uStack_560 == (char)uStack_570);
  local_718[9] = -(uStack_560._1_1_ == uStack_570._1_1_);
  local_718[10] = -(uStack_560._2_1_ == uStack_570._2_1_);
  local_718[0xb] = -(uStack_560._3_1_ == uStack_570._3_1_);
  local_718[0xc] = -(uStack_560._4_1_ == uStack_570._4_1_);
  local_718[0xd] = -(uStack_560._5_1_ == uStack_570._5_1_);
  local_718[0xe] = -(uStack_560._6_1_ == uStack_570._6_1_);
  local_718[0xf] = -(uStack_560._7_1_ == uStack_570._7_1_);
  auVar39 = local_718 >> 0x20;
  local_4c8 = local_718;
  auVar38 = local_4c8;
  local_4c8._8_8_ = local_718._8_8_;
  local_4d8._0_8_ = local_718._4_8_;
  local_4d8._12_4_ = 0;
  local_4d8._8_4_ = local_718._12_4_;
  local_2a8 = local_718._0_8_ & local_4d8._0_8_;
  uStack_2a0 = local_4c8._8_8_ & local_4d8._8_8_;
  local_718._8_8_ = uStack_2a0;
  local_718._0_8_ = local_2a8;
  local_380 = &local_6d8;
  local_388 = &local_6e8;
  local_390 = &local_738;
  local_3a0 = local_6a0;
  local_3a8 = local_6a8;
  local_3d = 0;
  local_3e = 0;
  local_3f = 0;
  local_40 = 0;
  local_41 = 0;
  local_42 = 0;
  local_43 = 0;
  local_44 = 0;
  local_45 = 3;
  local_46 = 3;
  local_47 = 3;
  local_48 = 3;
  local_49 = 4;
  local_4a = 4;
  local_4b = 4;
  local_4c = 4;
  local_418 = 0x303030304040404;
  uStack_410 = 0;
  local_2c9 = 0x80;
  local_69 = 0x80;
  local_6a = 0x80;
  local_6b = 0x80;
  local_6c = 0x80;
  local_6d = 0x80;
  local_6e = 0x80;
  local_6f = 0x80;
  local_70 = 0x80;
  local_71 = 0x80;
  local_72 = 0x80;
  local_73 = 0x80;
  local_74 = 0x80;
  local_75 = 0x80;
  local_76 = 0x80;
  local_77 = 0x80;
  local_78 = 0x80;
  local_428 = 0x8080808080808080;
  uStack_420 = 0x8080808080808080;
  local_438 = 0xff;
  uStack_437 = 0xff;
  uStack_436 = 0xff;
  uStack_435 = 0xff;
  uStack_434 = 0xff;
  uStack_433 = 0xff;
  uStack_432 = 0xff;
  uStack_431 = 0xff;
  uStack_430 = 0xff;
  uStack_42f = 0xff;
  uStack_42e = 0xff;
  uStack_42d = 0xff;
  uStack_42c = 0xff;
  uStack_42b = 0xff;
  uStack_42a = 0xff;
  uStack_429 = 0xff;
  local_1f8 = CONCAT44(uStack_6d4,local_6d8);
  uStack_1f0 = CONCAT44(uStack_6cc,uStack_6d0);
  local_138 = local_1f8 ^ 0x8080808080808080;
  uStack_130 = uStack_1f0 ^ 0x8080808080808080;
  local_218 = local_6e8;
  uStack_210 = uStack_6e0;
  local_1d8 = local_6e8 ^ 0x8080808080808080;
  uStack_1d0 = uStack_6e0 ^ 0x8080808080808080;
  auVar14._8_8_ = uStack_130;
  auVar14._0_8_ = local_138;
  auVar13._8_8_ = uStack_1d0;
  auVar13._0_8_ = local_1d8;
  local_3d8 = psubsb(auVar14,auVar13);
  local_288 = local_738;
  uStack_280 = uStack_730;
  local_278._0_8_ = local_3d8._4_8_;
  local_278._12_4_ = 0;
  local_278._8_4_ = local_3d8._12_4_;
  local_158 = local_278._0_8_ & local_738;
  uStack_150 = local_278._8_8_ & uStack_730;
  local_168 = local_3d8._0_8_;
  uStack_160 = local_3d8._8_8_;
  auVar12._8_8_ = uStack_150;
  auVar12._0_8_ = local_158;
  auVar40 = psubsb(auVar12,local_3d8);
  local_3b8 = auVar40._0_8_;
  uStack_3b0 = auVar40._8_8_;
  local_178 = local_3b8;
  uStack_170 = uStack_3b0;
  local_188 = local_3d8._0_8_;
  uStack_180 = local_3d8._8_8_;
  auVar40 = psubsb(auVar40,local_3d8);
  local_3b8 = auVar40._0_8_;
  uStack_3b0 = auVar40._8_8_;
  local_198 = local_3b8;
  uStack_190 = uStack_3b0;
  local_1a8 = local_3d8._0_8_;
  uStack_1a0 = local_3d8._8_8_;
  auVar40 = psubsb(auVar40,local_3d8);
  local_3b8 = auVar40._0_8_;
  uStack_3b0 = auVar40._8_8_;
  local_298 = local_3b8;
  uStack_290 = uStack_3b0;
  local_338 = local_3b8 & local_2a8;
  uStack_330 = uStack_3b0 & uStack_2a0;
  local_328._0_4_ = (undefined4)local_338;
  local_328._4_4_ = (undefined4)(local_338 >> 0x20);
  local_3b8 = CONCAT44((undefined4)local_328,(undefined4)local_328);
  uStack_3b0._0_4_ = local_328._4_4_;
  uStack_3b0._4_4_ = local_328._4_4_;
  local_f8 = local_3b8;
  uStack_f0 = uStack_3b0;
  auVar17._8_8_ = uStack_3b0;
  auVar17._0_8_ = local_3b8;
  auVar40 = paddsb(auVar17,ZEXT816(0x303030304040404));
  local_3c8 = auVar40._0_8_;
  uStack_3c0 = auVar40._8_8_;
  local_2e8 = local_3c8;
  uVar37 = local_2e8;
  uStack_2e0 = uStack_3c0;
  local_2f8 = local_3c8;
  uStack_2f0 = uStack_3c0;
  local_2e8._0_1_ = auVar40[0];
  local_2e8._1_1_ = auVar40[1];
  local_2e8._2_1_ = auVar40[2];
  local_2e8._3_1_ = auVar40[3];
  local_2e8._4_1_ = auVar40[4];
  local_2e8._5_1_ = auVar40[5];
  local_2e8._6_1_ = auVar40[6];
  local_2e8._7_1_ = auVar40[7];
  local_3c8._0_2_ = CONCAT11((undefined1)local_2e8,(undefined1)local_2e8);
  local_3c8._0_3_ = CONCAT12(local_2e8._1_1_,(undefined2)local_3c8);
  local_3c8._0_4_ = CONCAT13(local_2e8._1_1_,(undefined3)local_3c8);
  local_3c8._0_5_ = CONCAT14(local_2e8._2_1_,(undefined4)local_3c8);
  local_3c8._0_6_ = CONCAT15(local_2e8._2_1_,(undefined5)local_3c8);
  local_3c8._0_7_ = CONCAT16(local_2e8._3_1_,(undefined6)local_3c8);
  local_3c8 = CONCAT17(local_2e8._3_1_,(undefined7)local_3c8);
  uStack_3c0._0_1_ = local_2e8._4_1_;
  uStack_3c0._1_1_ = local_2e8._4_1_;
  uStack_3c0._2_1_ = local_2e8._5_1_;
  uStack_3c0._3_1_ = local_2e8._5_1_;
  uStack_3c0._4_1_ = local_2e8._6_1_;
  uStack_3c0._5_1_ = local_2e8._6_1_;
  uStack_3c0._6_1_ = local_2e8._7_1_;
  uStack_3c0._7_1_ = local_2e8._7_1_;
  local_18 = local_3c8;
  uStack_10 = uStack_3c0;
  local_1c = 0xb;
  auVar19._8_8_ = uStack_3c0;
  auVar19._0_8_ = local_3c8;
  auVar40 = psraw(auVar19,ZEXT416(0xb));
  local_3c8 = auVar40._0_8_;
  uStack_3c0 = auVar40._8_8_;
  local_98 = local_3c8;
  uStack_90 = uStack_3c0;
  local_a8 = local_3c8;
  uStack_a0 = uStack_3c0;
  auVar40 = packsswb(auVar40,auVar40);
  local_3c8 = auVar40._0_8_;
  uStack_3c0 = auVar40._8_8_;
  local_1c8 = 0xffffffffffffffff;
  uStack_1c0 = 0xffffffffffffffff;
  local_1b8 = local_3c8;
  uStack_1b0 = uStack_3c0;
  auVar11._8_8_ = 0xffffffffffffffff;
  auVar11._0_8_ = 0xffffffffffffffff;
  auVar41 = psubsb(auVar40,auVar11);
  local_3b8 = auVar41._0_8_;
  uStack_3b0 = auVar41._8_8_;
  local_308 = local_3b8;
  uVar36 = local_308;
  uStack_300 = uStack_3b0;
  local_318 = local_3b8;
  uStack_310 = uStack_3b0;
  local_308._0_1_ = auVar41[0];
  local_308._1_1_ = auVar41[1];
  local_308._2_1_ = auVar41[2];
  local_308._3_1_ = auVar41[3];
  local_308._4_1_ = auVar41[4];
  local_308._5_1_ = auVar41[5];
  local_308._6_1_ = auVar41[6];
  local_308._7_1_ = auVar41[7];
  local_3b8._0_2_ = CONCAT11((undefined1)local_308,(undefined1)local_308);
  local_3b8._0_3_ = CONCAT12(local_308._1_1_,(undefined2)local_3b8);
  local_3b8._0_4_ = CONCAT13(local_308._1_1_,(undefined3)local_3b8);
  local_3b8._0_5_ = CONCAT14(local_308._2_1_,(undefined4)local_3b8);
  local_3b8._0_6_ = CONCAT15(local_308._2_1_,(undefined5)local_3b8);
  local_3b8._0_7_ = CONCAT16(local_308._3_1_,(undefined6)local_3b8);
  local_3b8 = CONCAT17(local_308._3_1_,(undefined7)local_3b8);
  uStack_3b0._0_1_ = local_308._4_1_;
  uStack_3b0._1_1_ = local_308._4_1_;
  uStack_3b0._2_1_ = local_308._5_1_;
  uStack_3b0._3_1_ = local_308._5_1_;
  uStack_3b0._4_1_ = local_308._6_1_;
  uStack_3b0._5_1_ = local_308._6_1_;
  uStack_3b0._6_1_ = local_308._7_1_;
  uStack_3b0._7_1_ = local_308._7_1_;
  local_38 = local_3b8;
  uStack_30 = uStack_3b0;
  local_3c = 9;
  auVar18._8_8_ = uStack_3b0;
  auVar18._0_8_ = local_3b8;
  auVar41 = psraw(auVar18,ZEXT416(9));
  local_3b8 = auVar41._0_8_;
  uStack_3b0 = auVar41._8_8_;
  local_b8 = local_3b8;
  uStack_b0 = uStack_3b0;
  local_c8 = local_3b8;
  uStack_c0 = uStack_3b0;
  auVar41 = packsswb(auVar41,auVar41);
  local_d8 = local_738;
  uStack_d0 = uStack_730;
  local_3b8 = auVar41._0_8_;
  uStack_3b0 = auVar41._8_8_;
  local_e8 = local_3b8;
  uStack_e0 = uStack_3b0;
  local_358 = ~local_738 & local_3b8;
  uStack_350 = ~uStack_730 & uStack_3b0;
  local_348._0_4_ = (undefined4)local_358;
  local_348._4_4_ = (undefined4)(local_358 >> 0x20);
  local_3b8 = CONCAT44((undefined4)local_348,(undefined4)local_348);
  uStack_3b0._0_4_ = local_348._4_4_;
  uStack_3b0._4_4_ = local_348._4_4_;
  local_368 = local_3c8;
  uVar35 = local_368;
  uStack_360 = uStack_3c0;
  local_378 = local_3b8;
  uStack_370 = uStack_3b0;
  local_368._0_4_ = auVar40._0_4_;
  local_368._4_4_ = auVar40._4_4_;
  local_3c8 = CONCAT44((undefined4)local_348,(undefined4)local_368);
  uStack_3c0._0_4_ = local_368._4_4_;
  uStack_3c0._4_4_ = (undefined4)local_348;
  local_408 = uStack_3c0;
  uStack_400 = 0;
  local_1e8 = local_3c8;
  uStack_1e0 = uStack_3c0;
  auVar10._8_8_ = uStack_1d0;
  auVar10._0_8_ = local_1d8;
  auVar9._8_8_ = uStack_3c0;
  auVar9._0_8_ = local_3c8;
  local_3f8 = psubsb(auVar10,auVar9);
  local_128 = uStack_3c0;
  uStack_120 = 0;
  auVar16._8_8_ = uStack_130;
  auVar16._0_8_ = local_138;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uStack_3c0;
  local_3e8 = paddsb(auVar16,auVar15);
  local_238 = local_3f8._0_8_;
  uStack_230 = local_3f8._8_8_;
  uVar42 = local_3f8._8_8_ ^ 0x8080808080808080;
  local_658 = uVar3;
  local_648 = uVar24;
  local_628 = uVar25;
  local_5a8 = uVar26;
  uStack_5a0 = uStack_5b0;
  local_598 = uVar27;
  uStack_570 = uVar28;
  local_568 = uVar29;
  uStack_560 = uVar30;
  local_4e8 = uVar31;
  uStack_4e0 = uVar32;
  local_4d8 = auVar39;
  local_4c8 = auVar38;
  local_498 = uVar1;
  uStack_490 = uVar2;
  local_488 = uVar33;
  uStack_480 = uVar34;
  local_398 = local_718;
  local_368 = uVar35;
  local_348 = local_358;
  uStack_340 = uStack_350;
  local_328 = local_338;
  uStack_320 = uStack_330;
  local_308 = uVar36;
  local_2e8 = uVar37;
  local_2c8 = local_428;
  uStack_2c0 = uStack_420;
  local_2b8 = local_428;
  uStack_2b0 = uStack_420;
  local_278 = local_3d8 >> 0x20;
  local_248 = local_428;
  uStack_240 = uStack_420;
  local_228 = local_428;
  uStack_220 = uStack_420;
  local_208 = local_428;
  uStack_200 = uStack_420;
  local_148 = local_1d8;
  uStack_140 = uStack_1d0;
  local_118 = local_138;
  uStack_110 = uStack_130;
  local_108 = local_418;
  uStack_100 = uStack_410;
  local_88 = local_428;
  uStack_80 = uStack_420;
  local_68 = local_418;
  uStack_60 = uStack_410;
  *local_6a0 = local_3f8._0_8_ ^ 0x8080808080808080;
  puVar23[1] = uVar42;
  puVar23 = local_3a8;
  local_258 = local_3e8._0_8_;
  uStack_250 = local_3e8._8_8_;
  local_268 = local_428;
  uStack_260 = uStack_420;
  uVar42 = local_3e8._8_8_ ^ uStack_420;
  *local_3a8 = local_3e8._0_8_ ^ local_428;
  puVar23[1] = uVar42;
  v[1] = (longlong)local_718;
  v[0] = in_RSI;
  xx_storel_32((void *)((long)local_810 - (long)local_814),v);
  v_00[1] = extraout_RDX;
  v_00[0] = in_RSI;
  xx_storel_32((void *)((long)local_810 - (long)(local_814 * 2)),v_00);
  v_01[1] = extraout_RDX_00;
  v_01[0] = in_RSI;
  xx_storel_32(local_810,v_01);
  v_02[1] = extraout_RDX_01;
  v_02[0] = in_RSI;
  xx_storel_32((void *)((long)local_810 + (long)local_814),v_02);
  return;
}

Assistant:

void aom_lpf_horizontal_4_sse2(uint8_t *s, int p /* pitch */,
                               const uint8_t *_blimit, const uint8_t *_limit,
                               const uint8_t *_thresh) {
  const __m128i zero = _mm_setzero_si128();
  __m128i limit = _mm_unpacklo_epi32(_mm_loadl_epi64((const __m128i *)_blimit),
                                     _mm_loadl_epi64((const __m128i *)_limit));
  __m128i thresh =
      _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)_thresh), zero);

  __m128i qs1qs0, ps1ps0;
  __m128i p1, p0, q0, q1;

  p1 = xx_loadl_32(s - 2 * p);
  p0 = xx_loadl_32(s - 1 * p);
  q0 = xx_loadl_32(s - 0 * p);
  q1 = xx_loadl_32(s + 1 * p);

  lpf_internal_4_sse2(&p1, &p0, &q0, &q1, &limit, &thresh, &qs1qs0, &ps1ps0);

  xx_storel_32(s - 1 * p, ps1ps0);
  xx_storel_32(s - 2 * p, _mm_srli_si128(ps1ps0, 4));
  xx_storel_32(s + 0 * p, qs1qs0);
  xx_storel_32(s + 1 * p, _mm_srli_si128(qs1qs0, 4));
}